

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3.hpp
# Opt level: O1

void __thiscall njoy::ENDFtk::section::Type<3>::~Type(Type<3> *this)

{
  pointer pdVar1;
  pointer plVar2;
  
  pdVar1 = (this->table).yValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->table).yValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->table).xValues.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->table).xValues.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  plVar2 = (this->table).super_InterpolationBase.interpolationSchemeIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)(this->table).super_InterpolationBase.interpolationSchemeIndices.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar2);
  }
  plVar2 = (this->table).super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)(this->table).super_InterpolationBase.boundaryIndices.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)plVar2);
    return;
  }
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 3 > : protected Base {

    /* fields */
    TabulationRecord table;

  public:

    /* constructor */
    #include "ENDFtk/section/3/src/ctor.hpp"

    /* methods */

    /**
     *  @brief Return the mass difference Q value
     */
    double QM() const { return this->table.C1(); }

    /**
     *  @brief Return the mass difference Q value
     */
    double massDifferenceQValue() const { return this->QM(); }

    /**
     *  @brief Return the reaction Q value
     */
    double QI() const { return this->table.C2(); }

    /**
     *  @brief Return the reaction Q value
     */
    double reactionQValue() const { return this->QI(); }

    /**
     *  @brief Return the complex break up flag
     */
    int LR() const { return this->table.L2(); }

    /**
     *  @brief Return the complex break up flag
     */
    int complexBreakUp() const { return this->LR(); }

    /**
     *  @brief Return the number of interpolation ranges
     */
    long NR() const { return this->table.NR(); }

    /**
     *  @brief Return the number of points
     */
    long numberInterpolationRegions() const {

      return this->table.numberInterpolationRegions();
    }

    /**
     *  @brief Return the number of points
     */
    long NP() const { return this->table.NP(); }

    /**
     *  @brief Return the number of points
     */
    long numberPoints() const { return this->NP(); }

    /**
     *  @brief Return the interpolation type for each range
     */
    auto INT() const { return this->table.INT(); }

    /**
     *  @brief Return the interpolation type for each range
     */
    auto interpolants() const { return this->INT(); }

    /**
     *  @brief Return the interpolation boundaries
     */
    auto NBT() const { return this->table.NBT(); }

    /**
     *  @brief Return the interpolation boundaries
     */
    auto boundaries() const { return this->NBT(); }

    /**
     *  @brief Return the energy values
     */
    auto energies() const { return this->table.x(); }

    /**
     *  @brief Return the cross section values
     */
    auto crossSections() const { return this->table.y(); }

    /**
     *  @brief Return the number of lines in this MF3 section
     */
    long NC() const { return this->table.NC() + 1; }

    /**
     *  @brief Return the energy values (common interface for interpolation
     *         tables)
     */
    auto x() const { return this->energies(); }

    /**
     *  @brief Return the cross section values (common interface for interpolation
     *         tables)
     */
    auto y() const { return this->crossSections(); }

    #include "ENDFtk/section/3/src/print.hpp"

    using Base::MT;
    using Base::sectionNumber;
    using Base::ZA;
    using Base::targetIdentifier;
    using Base::atomicWeightRatio;
    using Base::AWR;
  }